

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::ShaderAtomicXorCase::verify
          (ShaderAtomicXorCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  uint uVar2;
  Precision PVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined7 uVar15;
  ulong uVar14;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  bool bVar20;
  int in_stack_00000008;
  long in_stack_00000010;
  Hex<8UL> local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  int local_1c8;
  uint local_1c4;
  long local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  lVar10 = 0;
  uVar18 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  do {
    uVar17 = uVar18;
    uVar2 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[lVar10 + 1];
    uVar18 = uVar2 * uVar17;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  local_1b8 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
              (long)(int)uVar18;
  PVar3 = (this->super_ShaderAtomicOpCase).m_precision;
  uVar13 = 0xff;
  if (PVar3 == PRECISION_MEDIUMP) {
    uVar13 = 0xffff;
  }
  uVar8 = 0xffffffff;
  if (PVar3 != PRECISION_HIGHP) {
    uVar8 = (uint)uVar13;
  }
  iVar6 = (int)local_1b8;
  bVar19 = iVar6 < 1;
  uVar15 = (undefined7)((ulong)uVar13 >> 8);
  if (0 < iVar6) {
    bVar20 = (this->super_ShaderAtomicOpCase).m_initialValue == 0;
    local_1b8 = local_1b8 & 0xffffffff;
    iVar6 = (int)sig;
    local_1c8 = iVar6 * uVar17 * uVar2;
    local_1c0 = (ulong)uVar18 - 1;
    local_1d0 = 0;
    uVar14 = (ulong)sig & 0xffffffff;
    local_1d8 = 0;
    local_1c4 = (uint)bVar20;
    do {
      iVar9 = (int)uVar14;
      lVar10 = local_1c0;
      bVar12 = bVar20;
      if (1 < (int)uVar18) {
        do {
          bVar12 = (bool)(bVar12 ^ *(int *)(siglen + (long)(int)uVar14) == 0);
          uVar14 = (ulong)(uint)((int)uVar14 + iVar6);
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      uVar14 = (ulong)((int)local_1d8 * in_stack_00000008);
      uVar4 = *(uint *)(in_stack_00000010 + uVar14);
      uVar5 = *(uint *)(siglen + (long)(int)(uVar18 * (int)local_1d8 * iVar6));
      uVar11 = ~uVar5;
      uVar7 = uVar11;
      if (!bVar12) {
        uVar7 = uVar5;
      }
      if ((uVar8 & (uVar7 ^ uVar4)) != 0) {
        local_1b0._0_8_ =
             ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ERROR: at group ",0x10);
        std::ostream::operator<<(poVar1,(int)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": expected ",0xb);
        local_1e0.value = (ulong)uVar5;
        tcu::Format::Hex<8UL>::toStream(&local_1e0,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," or ",4);
        local_1e0.value = (deUint64)uVar11;
        tcu::Format::Hex<8UL>::toStream(&local_1e0,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," (compare mask ",0xf);
        local_1e0.value = (deUint64)uVar8;
        tcu::Format::Hex<8UL>::toStream(&local_1e0,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"), got ",7);
        local_1e0.value = (ulong)uVar4;
        tcu::Format::Hex<8UL>::toStream(&local_1e0,(ostream *)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_01491285:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        uVar15 = (undefined7)(uVar14 >> 8);
        break;
      }
      if (0 < (int)uVar18) {
        uVar16 = 0;
        uVar14 = local_1d0;
        do {
          uVar4 = *(uint *)(tbslen + (long)(int)uVar14);
          uVar7 = uVar4 & uVar8;
          if ((((uVar7 != 0) && (uVar7 != uVar8)) && (uVar7 != (uVar5 & uVar8))) &&
             (uVar7 != (uVar11 & uVar8))) {
            local_1b0._0_8_ =
                 ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"ERROR: at group ",0x10);
            std::ostream::operator<<(poVar1,(int)local_1d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,", invocation ",0xd);
            std::ostream::operator<<(poVar1,(int)uVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,": found unexpected value ",0x19);
            local_1e0.value = (ulong)uVar4;
            tcu::Format::Hex<8UL>::toStream(&local_1e0,(ostream *)poVar1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_01491285;
          }
          uVar16 = uVar16 + 1;
          uVar14 = (ulong)(uint)((int)uVar14 + (int)tbs);
        } while (uVar18 != uVar16);
      }
      local_1d8 = local_1d8 + 1;
      bVar19 = local_1b8 <= local_1d8;
      uVar15 = (undefined7)(uVar14 >> 8);
      uVar14 = (ulong)(uint)(iVar9 + local_1c8);
      local_1d0 = (ulong)((int)local_1d0 + uVar17 * (int)tbs * uVar2);
    } while (local_1d8 != local_1b8);
  }
  return (int)CONCAT71(uVar15,bVar19);
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	compareMask		= numBits == 32 ? ~0u : (1u<<numBits)-1u;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupOutput		= *(const deUint32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			const deUint32	randomValue		= *(const deInt32*)((const deUint8*)inputs + inputStride*groupOffset);
			const deUint32	expected0		= randomValue ^ 0u;
			const deUint32	expected1		= randomValue ^ ~0u;
			int				numXorZeros		= (m_initialValue == 0) ? 1 : 0;

			for (int localNdx = 1; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 inputValue = *(const deUint32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				if (inputValue == 0)
					numXorZeros += 1;
			}

			const deUint32 expected = (numXorZeros%2 == 0) ? expected0 : expected1;

			if ((groupOutput & compareMask) != (expected & compareMask))
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected " << tcu::toHex(expected0)
													   << " or " << tcu::toHex(expected1) << " (compare mask " << tcu::toHex(compareMask)
													   << "), got " << tcu::toHex(groupOutput) << TestLog::EndMessage;
				return false;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 outputValue = *(const deUint32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if ((outputValue & compareMask) != 0 &&
					(outputValue & compareMask) != compareMask &&
					(outputValue & compareMask) != (expected0&compareMask) &&
					(outputValue & compareMask) != (expected1&compareMask))
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << tcu::toHex(outputValue)
									   << TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}